

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O3

uint16_t __thiscall Samba::checksumBuffer(Samba *this,uint32_t start_addr,uint32_t size)

{
  SerialPort *pSVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  undefined8 *puVar6;
  uint8_t cmd [64];
  char local_68;
  char local_67 [8];
  undefined1 local_5f;
  
  if ((this->_canChecksumBuffer != false) && (size < 0x1001)) {
    if (this->_debug == true) {
      printf("%s(start_addr=%#x, size=%#x) = ","checksumBuffer",(ulong)start_addr,(ulong)size);
    }
    uVar2 = snprintf(&local_68,0x40,"Z%08X,%08X#",(ulong)start_addr,(ulong)size);
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    uVar3 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,&local_68,(ulong)uVar2);
    if (uVar3 == uVar2) {
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[9])(pSVar1,5000);
      local_68 = '\0';
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[5])(pSVar1,&local_68,0xc);
      (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t
         .super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
         super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[9])();
      if (local_68 == 'Z') {
        local_5f = 0;
        piVar4 = __errno_location();
        *piVar4 = 0;
        uVar5 = strtol(local_67,(char **)0x0,0x10);
        if (*piVar4 == 0) {
          if (this->_debug == true) {
            printf("%x\n",uVar5 & 0xffffffff);
          }
          return (uint16_t)uVar5;
        }
      }
    }
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = &PTR__exception_001185a0;
  __cxa_throw(puVar6,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

uint16_t
Samba::checksumBuffer(uint32_t start_addr, uint32_t size)
{
    if (!_canChecksumBuffer)
        throw SambaError();

    if (size > checksumBufferSize())
        throw SambaError();
        
    if (_debug)
        printf("%s(start_addr=%#x, size=%#x) = ", __FUNCTION__, start_addr, size);

    uint8_t cmd[64];
    int l = snprintf((char*) cmd, sizeof(cmd), "Z%08X,%08X#", start_addr, size);
    if (_port->write(cmd, l) != l)
        throw SambaError();
    _port->timeout(TIMEOUT_LONG);
    cmd[0] = 0;
    _port->read(cmd, 12); // Expects "Z00000000#\n\r"
    _port->timeout(TIMEOUT_NORMAL);
    if (cmd[0] != 'Z')
        throw SambaError();

    cmd[9] = 0;
    errno = 0;
    uint32_t res = strtol((char*) &cmd[1], NULL, 16);
    if (errno != 0)
        throw SambaError();
    if (_debug)
        printf("%x\n", res);
    return res;
}